

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O0

bool __thiscall RenX::BanDatabase::initialize(BanDatabase *this)

{
  byte bVar1;
  Config *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  BanDatabase *local_10;
  BanDatabase *this_local;
  
  local_10 = this;
  getCore();
  this_00 = (Config *)Jupiter::Plugin::getConfig();
  local_40 = sv("BanDB",5);
  s_abi_cxx11_(&local_60,"Bans.db",7);
  Jupiter::Config::get<std::__cxx11::string>(&local_30,this_00,local_40,&local_60);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_filename,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = Jupiter::Database::process_file((string *)this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool RenX::BanDatabase::initialize() {
	m_filename = RenX::getCore()->getConfig().get("BanDB"sv, "Bans.db"s);
	return this->process_file(m_filename);
}